

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationYY.hpp
# Opt level: O3

SquareMatrix<std::complex<double>_> __thiscall
qclab::qgates::RotationYY<std::complex<double>_>::matrix(RotationYY<std::complex<double>_> *this)

{
  undefined8 uVar1;
  ulong uVar2;
  undefined8 *puVar3;
  data_type extraout_RDX;
  long in_RSI;
  SquareMatrix<std::complex<double>_> SVar4;
  
  uVar1 = *(undefined8 *)(in_RSI + 0x18);
  uVar2 = *(ulong *)(in_RSI + 0x20);
  (this->super_QRotationGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)0x4;
  puVar3 = (undefined8 *)operator_new__(0x100);
  *(undefined8 **)&(this->super_QRotationGate2<std::complex<double>_>).super_QAdjustable = puVar3;
  *puVar3 = uVar1;
  puVar3[5] = 0;
  puVar3[6] = 0;
  puVar3[3] = 0;
  puVar3[4] = 0;
  puVar3[1] = 0;
  puVar3[2] = 0;
  puVar3[7] = uVar2;
  puVar3[8] = 0;
  puVar3[9] = 0;
  puVar3[10] = uVar1;
  *(undefined4 *)(puVar3 + 0xb) = 0;
  *(undefined4 *)((long)puVar3 + 0x5c) = 0;
  *(undefined4 *)(puVar3 + 0xc) = 0;
  *(undefined4 *)((long)puVar3 + 100) = 0x80000000;
  puVar3[0xd] = uVar2 ^ 0x8000000000000000;
  puVar3[0x10] = 0;
  puVar3[0x11] = 0;
  puVar3[0xe] = 0;
  puVar3[0xf] = 0;
  puVar3[0x12] = 0x8000000000000000;
  puVar3[0x13] = uVar2 ^ 0x8000000000000000;
  puVar3[0x14] = uVar1;
  puVar3[0x17] = 0;
  puVar3[0x18] = 0;
  puVar3[0x15] = 0;
  puVar3[0x16] = 0;
  puVar3[0x19] = uVar2;
  puVar3[0x1a] = 0;
  puVar3[0x1b] = 0;
  puVar3[0x1c] = 0;
  puVar3[0x1d] = 0;
  puVar3[0x1e] = uVar1;
  puVar3[0x1f] = 0;
  SVar4.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  SVar4.size_ = (size_type_conflict)this;
  return SVar4;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          const T d = this->cos() ;
          const T o = T(0,this->sin()) ;
          return qclab::dense::SquareMatrix< T >( d , 0 , 0 , o ,
                                                  0 , d ,-o , 0 ,
                                                  0 ,-o , d , 0 ,
                                                  o , 0 , 0 , d ) ;
        }